

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void __thiscall
tcu::PixelBufferAccess::setPixel(PixelBufferAccess *this,Vec4 *color,int x,int y,int z)

{
  ChannelType type;
  ChannelOrder order;
  int i;
  uint uVar1;
  uint uVar2;
  Float<unsigned_int,_5,_6,_15,_2U> FVar3;
  Float<unsigned_int,_5,_6,_15,_2U> FVar4;
  Float<unsigned_int,_5,_5,_15,_2U> FVar5;
  Float<unsigned_int,_8,_23,_127,_3U> FVar6;
  TextureSwizzle *pTVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  ushort uVar11;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  uint *dst;
  ulong uVar17;
  int iVar18;
  ushort uVar19;
  bool bVar20;
  deUint32 u32;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float q;
  Vector<int,_4> res;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_34;
  uint uVar12;
  
  dst = (uint *)((long)(this->super_ConstPixelBufferAccess).m_data +
                (long)(z * (this->super_ConstPixelBufferAccess).m_pitch.m_data[2]) +
                (long)(y * (this->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                (long)(x * (this->super_ConstPixelBufferAccess).m_pitch.m_data[0]));
  type = (this->super_ConstPixelBufferAccess).m_format.type;
  switch(type) {
  case UNORM_INT8:
    switch((this->super_ConstPixelBufferAccess).m_format.order) {
    case RGB:
    case sRGB:
      uVar2 = 0x7e - ((int)color->m_data[0] >> 0x17);
      uVar1 = (((uint)color->m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)dst = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[1] >> 0x17);
      uVar1 = (((uint)color->m_data[1] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 1) = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[2] >> 0x17);
      uVar1 = (((uint)color->m_data[2] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 2) = (char)(uVar1 >> 0x18);
      return;
    case RGBA:
    case sRGBA:
      uVar2 = 0x7e - ((int)color->m_data[0] >> 0x17);
      uVar1 = (((uint)color->m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)dst = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[1] >> 0x17);
      uVar1 = (((uint)color->m_data[1] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 1) = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[2] >> 0x17);
      uVar1 = (((uint)color->m_data[2] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 2) = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[3] >> 0x17);
      uVar1 = (((uint)color->m_data[3] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 3) = (char)(uVar1 >> 0x18);
      return;
    }
    switch(type) {
    case UNORM_BYTE_44:
      goto switchD_0090a568_caseD_7;
    case UNORM_SHORT_565:
      goto switchD_0090a568_caseD_8;
    case UNORM_SHORT_555:
      goto switchD_0090a568_caseD_9;
    case UNORM_SHORT_4444:
      goto switchD_0090a568_caseD_a;
    case UNORM_SHORT_5551:
      goto switchD_0090a568_caseD_b;
    case UNORM_SHORT_1555:
      goto switchD_0090a568_caseD_c;
    case UNORM_INT_101010:
      goto switchD_0090a568_caseD_d;
    case SNORM_INT_1010102_REV:
      goto switchD_0090a568_caseD_e;
    case UNORM_INT_1010102_REV:
      goto switchD_0090a568_caseD_f;
    case UNSIGNED_BYTE_44:
      goto switchD_0090a568_caseD_10;
    case UNSIGNED_SHORT_565:
      goto switchD_0090a568_caseD_11;
    case UNSIGNED_SHORT_4444:
      goto switchD_0090a568_caseD_12;
    case UNSIGNED_SHORT_5551:
      goto switchD_0090a568_caseD_13;
    case SIGNED_INT_1010102_REV:
      goto switchD_0090a568_caseD_14;
    case UNSIGNED_INT_1010102_REV:
      goto switchD_0090a568_caseD_15;
    case UNSIGNED_INT_11F_11F_10F_REV:
      goto switchD_0090a568_caseD_16;
    case UNSIGNED_INT_999_E5_REV:
      goto switchD_0090a568_caseD_17;
    default:
      goto switchD_0090a568_caseD_4;
    }
  default:
switchD_0090a568_caseD_4:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
    uVar1 = getNumUsedChannels(order);
    pTVar7 = getChannelWriteSwizzle(order);
    if (uVar1 == 0) {
      return;
    }
    uVar2 = getChannelSize(type);
    uVar17 = 0;
    do {
      anon_unknown_74::floatToChannel
                ((deUint8 *)dst,color->m_data[(int)pTVar7->components[uVar17]],
                 (this->super_ConstPixelBufferAccess).m_format.type);
      uVar17 = uVar17 + 1;
      dst = (uint *)((long)dst + (ulong)uVar2);
    } while (uVar1 != uVar17);
    return;
  case UNORM_BYTE_44:
switchD_0090a568_caseD_7:
    fVar22 = color->m_data[0] * 15.0;
    fVar24 = floorf(fVar22);
    fVar24 = fVar22 - fVar24;
    lVar8 = (long)(fVar22 - fVar24);
    if ((fVar24 != 0.5) || (NAN(fVar24))) {
      if (0.5 < fVar24) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0xf;
    if (uVar1 < 0xf) {
      uVar2 = uVar1;
    }
    fVar22 = color->m_data[1] * 15.0;
    fVar24 = floorf(fVar22);
    fVar24 = fVar22 - fVar24;
    lVar8 = (long)(fVar22 - fVar24);
    if ((fVar24 != 0.5) || (NAN(fVar24))) {
      if (0.5 < fVar24) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar15 = 0xf;
    if (uVar1 < 0xf) {
      uVar15 = uVar1;
    }
    bVar10 = (byte)uVar15 | (byte)(uVar2 << 4);
LAB_0090b3ea:
    *(byte *)dst = bVar10;
    return;
  case UNORM_SHORT_565:
switchD_0090a568_caseD_8:
    bVar20 = (this->super_ConstPixelBufferAccess).m_format.order == RGB;
    fVar24 = color->m_data[(ulong)bVar20 * 2];
    fVar22 = color->m_data[1];
    fVar23 = color->m_data[(ulong)!bVar20 * 2] * 31.0;
    fVar21 = floorf(fVar23);
    fVar21 = fVar23 - fVar21;
    lVar8 = (long)(fVar23 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    uVar19 = (ushort)(uVar2 << 0xb);
    fVar22 = fVar22 * 63.0;
    fVar23 = floorf(fVar22);
    fVar23 = fVar22 - fVar23;
    lVar8 = (long)(fVar22 - fVar23);
    if ((fVar23 != 0.5) || (NAN(fVar23))) {
      if (0.5 < fVar23) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    bVar20 = uVar1 < 0x3f;
    uVar2 = 0x3f;
    break;
  case UNORM_SHORT_555:
switchD_0090a568_caseD_9:
    bVar20 = (this->super_ConstPixelBufferAccess).m_format.order == RGB;
    fVar22 = color->m_data[1];
    fVar24 = color->m_data[(ulong)bVar20 * 2];
    fVar21 = color->m_data[(ulong)!bVar20 * 2] * 31.0;
    fVar23 = floorf(fVar21);
    fVar23 = fVar21 - fVar23;
    lVar8 = (long)(fVar21 - fVar23);
    if ((fVar23 != 0.5) || (NAN(fVar23))) {
      if (0.5 < fVar23) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    uVar19 = (ushort)(uVar2 << 10);
    fVar22 = fVar22 * 31.0;
    fVar23 = floorf(fVar22);
    fVar23 = fVar22 - fVar23;
    lVar8 = (long)(fVar22 - fVar23);
    if ((fVar23 != 0.5) || (NAN(fVar23))) {
      if (0.5 < fVar23) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    bVar20 = uVar1 < 0x1f;
    uVar2 = 0x1f;
    break;
  case UNORM_SHORT_4444:
switchD_0090a568_caseD_a:
    bVar20 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar22 = color->m_data[1];
    fVar24 = color->m_data[3];
    fVar23 = color->m_data[(ulong)bVar20 * 2];
    local_34 = color->m_data[(ulong)!bVar20 * 2] * 15.0;
    fVar21 = floorf(local_34);
    fVar21 = local_34 - fVar21;
    lVar8 = (long)(local_34 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0xf;
    if (uVar1 < 0xf) {
      uVar2 = uVar1;
    }
    fVar22 = fVar22 * 15.0;
    fVar21 = floorf(fVar22);
    fVar21 = fVar22 - fVar21;
    lVar8 = (long)(fVar22 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar15 = 0xf;
    if (uVar1 < 0xf) {
      uVar15 = uVar1;
    }
    fVar23 = fVar23 * 15.0;
    fVar22 = floorf(fVar23);
    fVar22 = fVar23 - fVar22;
    lVar8 = (long)(fVar23 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar12 = 0xf;
    if (uVar1 < 0xf) {
      uVar12 = uVar1;
    }
    uVar19 = (ushort)(uVar12 << 4) | (ushort)(uVar15 << 8) | (ushort)(uVar2 << 0xc);
    fVar24 = fVar24 * 15.0;
    fVar22 = floorf(fVar24);
    fVar22 = fVar24 - fVar22;
    lVar8 = (long)(fVar24 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    bVar20 = uVar1 < 0xf;
    uVar11 = 0xf;
    goto LAB_0090b4ee;
  case UNORM_SHORT_5551:
switchD_0090a568_caseD_b:
    bVar20 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar22 = color->m_data[1];
    fVar24 = color->m_data[3];
    fVar23 = color->m_data[(ulong)bVar20 * 2];
    local_34 = color->m_data[(ulong)!bVar20 * 2] * 31.0;
    fVar21 = floorf(local_34);
    fVar21 = local_34 - fVar21;
    lVar8 = (long)(local_34 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    fVar22 = fVar22 * 31.0;
    fVar21 = floorf(fVar22);
    fVar21 = fVar22 - fVar21;
    lVar8 = (long)(fVar22 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar15 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar15 = uVar1;
    }
    fVar23 = fVar23 * 31.0;
    fVar22 = floorf(fVar23);
    fVar22 = fVar23 - fVar22;
    lVar8 = (long)(fVar23 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar12 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar12 = uVar1;
    }
    fVar22 = floorf(fVar24);
    fVar22 = fVar24 - fVar22;
    lVar8 = (long)(fVar24 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    *(ushort *)dst =
         ((ushort)(uVar15 << 6) | (ushort)(uVar2 << 0xb)) + (short)uVar12 * 2 | (ushort)(0 < lVar8);
    return;
  case UNORM_SHORT_1555:
switchD_0090a568_caseD_c:
    local_34 = color->m_data[3];
    fVar22 = color->m_data[0];
    fVar24 = color->m_data[1];
    fVar23 = color->m_data[2];
    fVar21 = floorf(local_34);
    fVar21 = local_34 - fVar21;
    lVar8 = (long)(local_34 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    fVar22 = fVar22 * 31.0;
    fVar21 = floorf(fVar22);
    fVar21 = fVar22 - fVar21;
    lVar9 = (long)(fVar22 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar9 = lVar9 + 1;
      }
    }
    else {
      lVar9 = lVar9 + (ulong)((uint)lVar9 & 1);
    }
    lVar14 = 0xffffffff;
    if (lVar9 < 0xffffffff) {
      lVar14 = lVar9;
    }
    uVar1 = 0;
    if (0 < lVar14) {
      uVar1 = (uint)lVar14;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    fVar24 = fVar24 * 31.0;
    fVar22 = floorf(fVar24);
    fVar22 = fVar24 - fVar22;
    lVar9 = (long)(fVar24 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar9 = lVar9 + 1;
      }
    }
    else {
      lVar9 = lVar9 + (ulong)((uint)lVar9 & 1);
    }
    lVar14 = 0xffffffff;
    if (lVar9 < 0xffffffff) {
      lVar14 = lVar9;
    }
    uVar1 = 0;
    if (0 < lVar14) {
      uVar1 = (uint)lVar14;
    }
    uVar15 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar15 = uVar1;
    }
    fVar23 = fVar23 * 31.0;
    fVar22 = floorf(fVar23);
    fVar22 = fVar23 - fVar22;
    lVar9 = (long)(fVar23 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar9 = lVar9 + 1;
      }
    }
    else {
      lVar9 = lVar9 + (ulong)((uint)lVar9 & 1);
    }
    lVar14 = 0xffffffff;
    if (lVar9 < 0xffffffff) {
      lVar14 = lVar9;
    }
    uVar1 = 0;
    if (0 < lVar14) {
      uVar1 = (uint)lVar14;
    }
    uVar12 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar12 = uVar1;
    }
    uVar11 = (ushort)uVar12 |
             (ushort)(uVar15 << 5) | (ushort)(uVar2 << 10) | (ushort)(0 < lVar8) << 0xf;
    goto LAB_0090b4f4;
  case UNORM_INT_101010:
switchD_0090a568_caseD_d:
    fVar22 = color->m_data[0] * 1023.0;
    fVar24 = floorf(fVar22);
    fVar24 = fVar22 - fVar24;
    lVar8 = (long)(fVar22 - fVar24);
    if ((fVar24 != 0.5) || (NAN(fVar24))) {
      if (0.5 < fVar24) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar2 = uVar1;
    }
    fVar22 = color->m_data[1] * 1023.0;
    fVar24 = floorf(fVar22);
    fVar24 = fVar22 - fVar24;
    lVar8 = (long)(fVar22 - fVar24);
    if ((fVar24 != 0.5) || (NAN(fVar24))) {
      if (0.5 < fVar24) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar15 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar15 = uVar1;
    }
    fVar22 = color->m_data[2] * 1023.0;
    fVar24 = floorf(fVar22);
    fVar24 = fVar22 - fVar24;
    lVar8 = (long)(fVar22 - fVar24);
    if ((fVar24 != 0.5) || (NAN(fVar24))) {
      if (0.5 < fVar24) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar12 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar12 = uVar1;
    }
    uVar1 = (uVar15 << 0xc | uVar2 << 0x16) + uVar12 * 4;
LAB_0090b601:
    *dst = uVar1;
    return;
  case SNORM_INT_1010102_REV:
switchD_0090a568_caseD_e:
    bVar20 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar22 = color->m_data[1];
    fVar24 = color->m_data[3];
    fVar23 = color->m_data[(ulong)bVar20 * 2];
    local_34 = color->m_data[(ulong)!bVar20 * 2] * 511.0;
    fVar21 = floorf(local_34);
    fVar21 = local_34 - fVar21;
    lVar8 = (long)(local_34 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    lVar14 = -0x80000000;
    if (-0x80000000 < lVar9) {
      lVar14 = lVar9;
    }
    uVar1 = 0x1ff;
    if ((int)(uint)lVar14 < 0x1ff) {
      uVar1 = (uint)lVar14;
    }
    uVar2 = 0x201;
    if (-0x200 < lVar8) {
      uVar2 = uVar1 & 0x3ff;
    }
    fVar22 = fVar22 * 511.0;
    fVar21 = floorf(fVar22);
    fVar21 = fVar22 - fVar21;
    lVar8 = (long)(fVar22 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    lVar14 = -0x80000000;
    if (-0x80000000 < lVar9) {
      lVar14 = lVar9;
    }
    uVar1 = 0x1ff;
    if ((int)(uint)lVar14 < 0x1ff) {
      uVar1 = (uint)lVar14;
    }
    uVar15 = 0x80400;
    if (-0x200 < lVar8) {
      uVar15 = (uVar1 & 0x3ff) << 10;
    }
    fVar23 = fVar23 * 511.0;
    fVar22 = floorf(fVar23);
    fVar22 = fVar23 - fVar22;
    lVar8 = (long)(fVar23 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    lVar14 = -0x80000000;
    if (-0x80000000 < lVar9) {
      lVar14 = lVar9;
    }
    uVar1 = 0x1ff;
    if ((int)(uint)lVar14 < 0x1ff) {
      uVar1 = (uint)lVar14;
    }
    uVar12 = 0x20100000;
    if (-0x200 < lVar8) {
      uVar12 = (uVar1 & 0x3ff) << 0x14;
    }
    fVar22 = floorf(fVar24);
    fVar22 = fVar24 - fVar22;
    lVar8 = (long)(fVar24 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    iVar18 = -0x80000000;
    if (-0x80000000 < lVar9) {
      iVar18 = (int)lVar9;
    }
    iVar16 = 1;
    if (iVar18 < 1) {
      iVar16 = iVar18;
    }
    uVar1 = 0xc0000000;
    if (-2 < lVar8) {
      uVar1 = iVar16 << 0x1e;
    }
    *dst = uVar15 | uVar2 | uVar12 | uVar1;
    return;
  case UNORM_INT_1010102_REV:
switchD_0090a568_caseD_f:
    bVar20 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar22 = color->m_data[1];
    fVar24 = color->m_data[3];
    fVar23 = color->m_data[(ulong)bVar20 * 2];
    local_34 = color->m_data[(ulong)!bVar20 * 2] * 1023.0;
    fVar21 = floorf(local_34);
    fVar21 = local_34 - fVar21;
    lVar8 = (long)(local_34 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar2 = uVar1;
    }
    fVar22 = fVar22 * 1023.0;
    fVar21 = floorf(fVar22);
    fVar21 = fVar22 - fVar21;
    lVar8 = (long)(fVar22 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar15 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar15 = uVar1;
    }
    fVar23 = fVar23 * 1023.0;
    fVar22 = floorf(fVar23);
    fVar22 = fVar23 - fVar22;
    lVar8 = (long)(fVar23 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar12 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar12 = uVar1;
    }
    fVar24 = fVar24 * 3.0;
    fVar22 = floorf(fVar24);
    fVar22 = fVar24 - fVar22;
    lVar8 = (long)(fVar24 - fVar22);
    if ((fVar22 != 0.5) || (NAN(fVar22))) {
      if (0.5 < fVar22) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar13 = 3;
    if (uVar1 < 3) {
      uVar13 = uVar1;
    }
    *dst = uVar13 << 0x1e | uVar12 << 0x14 | uVar15 << 10 | uVar2;
    return;
  case UNSIGNED_BYTE_44:
switchD_0090a568_caseD_10:
    uVar1 = (uint)(long)color->m_data[0];
    if (0xe < uVar1) {
      uVar1 = 0xf;
    }
    uVar15 = (uint)(long)color->m_data[1];
    uVar2 = 0xf;
    if (uVar15 < 0xf) {
      uVar2 = uVar15;
    }
    bVar10 = (byte)uVar2 | (byte)(uVar1 << 4);
    goto LAB_0090b3ea;
  case UNSIGNED_SHORT_565:
switchD_0090a568_caseD_11:
    local_48 = 0;
    uStack_40 = 0;
    lVar8 = 0;
    do {
      *(int *)((long)&local_48 + lVar8 * 4) = (int)(long)color->m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    FVar6.m_value = (uint)uStack_40;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGB) {
      FVar6.m_value = local_48._0_4_;
      local_48._0_4_ = (uint)uStack_40;
    }
    if (0x1e < FVar6.m_value) {
      FVar6.m_value = 0x1f;
    }
    uVar1 = 0x3f;
    if (local_48._4_4_ < 0x3f) {
      uVar1 = local_48._4_4_;
    }
    uVar2 = 0x1f;
    if (local_48._0_4_ < 0x1f) {
      uVar2 = local_48._0_4_;
    }
    *(ushort *)dst = (ushort)uVar2 | (ushort)(uVar1 << 5) | (ushort)(FVar6.m_value << 0xb);
    return;
  case UNSIGNED_SHORT_4444:
switchD_0090a568_caseD_12:
    local_48 = 0;
    uStack_40 = 0;
    lVar8 = 0;
    do {
      *(int *)((long)&local_48 + lVar8 * 4) = (int)(long)color->m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    FVar6.m_value = (uint)uStack_40;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      FVar6.m_value = local_48._0_4_;
      local_48._0_4_ = (uint)uStack_40;
    }
    if (0xe < FVar6.m_value) {
      FVar6.m_value = 0xf;
    }
    if (0xe < local_48._4_4_) {
      local_48._4_4_ = 0xf;
    }
    if (0xe < local_48._0_4_) {
      local_48._0_4_ = 0xf;
    }
    uVar1 = 0xf;
    if (uStack_40._4_4_ < 0xf) {
      uVar1 = uStack_40._4_4_;
    }
    *(ushort *)dst =
         (ushort)uVar1 | (ushort)(local_48._0_4_ << 4) |
         (ushort)(local_48._4_4_ << 8) | (ushort)(FVar6.m_value << 0xc);
    return;
  case UNSIGNED_SHORT_5551:
switchD_0090a568_caseD_13:
    local_48 = 0;
    uStack_40 = 0;
    lVar8 = 0;
    do {
      *(int *)((long)&local_48 + lVar8 * 4) = (int)(long)color->m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    FVar6.m_value = (uint)uStack_40;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      FVar6.m_value = local_48._0_4_;
      local_48._0_4_ = (uint)uStack_40;
    }
    if (0x1e < FVar6.m_value) {
      FVar6.m_value = 0x1f;
    }
    if (0x1e < local_48._4_4_) {
      local_48._4_4_ = 0x1f;
    }
    uVar1 = 0x1f;
    if (local_48._0_4_ < 0x1f) {
      uVar1 = local_48._0_4_;
    }
    *(ushort *)dst =
         (ushort)(uStack_40._4_4_ != 0) |
         ((ushort)(local_48._4_4_ << 6) | (ushort)(FVar6.m_value << 0xb)) + (short)uVar1 * 2;
    return;
  case SIGNED_INT_1010102_REV:
switchD_0090a568_caseD_14:
    local_48 = 0;
    uStack_40 = 0;
    lVar8 = 0;
    do {
      *(int *)((long)&local_48 + lVar8 * 4) = (int)color->m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    FVar6.m_value = (uint)uStack_40;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      FVar6.m_value = local_48._0_4_;
      local_48._0_4_ = (uint)uStack_40;
    }
    if (0x1fe < (int)FVar6.m_value) {
      FVar6.m_value = 0x1ff;
    }
    if ((int)FVar6.m_value < -0x1ff) {
      FVar6.m_value = 0xfffffe00;
    }
    if (0x1fe < (int)local_48._4_4_) {
      local_48._4_4_ = 0x1ff;
    }
    if ((int)local_48._4_4_ < -0x1ff) {
      local_48._4_4_ = 0xfffffe00;
    }
    uVar1 = 0x1ff;
    if ((int)local_48._0_4_ < 0x1ff) {
      uVar1 = local_48._0_4_;
    }
    if ((int)uVar1 < -0x1ff) {
      uVar1 = 0xfffffe00;
    }
    iVar18 = 1;
    if ((int)uStack_40._4_4_ < 1) {
      iVar18 = uStack_40._4_4_;
    }
    iVar16 = -2;
    if (-2 < iVar18) {
      iVar16 = iVar18;
    }
    uVar1 = iVar16 << 0x1e | (uVar1 & 0x3ff) << 0x14 | (local_48._4_4_ & 0x3ff) << 10 |
            FVar6.m_value & 0x3ff;
LAB_0090ae9b:
    *dst = uVar1;
    return;
  case UNSIGNED_INT_1010102_REV:
switchD_0090a568_caseD_15:
    local_48 = 0;
    uStack_40 = 0;
    lVar8 = 0;
    do {
      *(int *)((long)&local_48 + lVar8 * 4) = (int)(long)color->m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    FVar6.m_value = (uint)uStack_40;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      FVar6.m_value = local_48._0_4_;
      local_48._0_4_ = (uint)uStack_40;
    }
    if (0x3fe < FVar6.m_value) {
      FVar6.m_value = 0x3ff;
    }
    if (0x3fe < local_48._4_4_) {
      local_48._4_4_ = 0x3ff;
    }
    uVar1 = 0x3ff;
    if (local_48._0_4_ < 0x3ff) {
      uVar1 = local_48._0_4_;
    }
    uVar2 = 3;
    if (uStack_40._4_4_ < 3) {
      uVar2 = uStack_40._4_4_;
    }
    uVar1 = uVar2 << 0x1e | uVar1 << 0x14 | local_48._4_4_ << 10 | FVar6.m_value;
    goto LAB_0090ae9b;
  case UNSIGNED_INT_11F_11F_10F_REV:
switchD_0090a568_caseD_16:
    local_48._0_4_ = (StorageType_conflict)color->m_data[0];
    FVar3 = Float<unsigned_int,5,6,15,2u>::convert<unsigned_int,8,23,127,3u>
                      ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_48);
    local_48._0_4_ = (StorageType_conflict)color->m_data[1];
    FVar4 = Float<unsigned_int,5,6,15,2u>::convert<unsigned_int,8,23,127,3u>
                      ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_48);
    local_48 = CONCAT44(local_48._4_4_,color->m_data[2]);
    FVar5 = Float<unsigned_int,5,5,15,2u>::convert<unsigned_int,8,23,127,3u>
                      ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_48);
    uVar1 = FVar5.m_value << 0x16 | FVar4.m_value << 0xb | FVar3.m_value;
    goto LAB_0090b601;
  case UNSIGNED_INT_999_E5_REV:
switchD_0090a568_caseD_17:
    uVar1 = packRGB999E5(color);
    goto LAB_0090b601;
  }
  if (bVar20) {
    uVar2 = uVar1;
  }
  uVar19 = (ushort)(uVar2 << 5) | uVar19;
  fVar24 = fVar24 * 31.0;
  fVar22 = floorf(fVar24);
  fVar22 = fVar24 - fVar22;
  lVar8 = (long)(fVar24 - fVar22);
  if ((fVar22 != 0.5) || (NAN(fVar22))) {
    if (0.5 < fVar22) {
      lVar8 = lVar8 + 1;
    }
  }
  else {
    lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
  }
  lVar9 = 0xffffffff;
  if (lVar8 < 0xffffffff) {
    lVar9 = lVar8;
  }
  uVar1 = 0;
  if (0 < lVar9) {
    uVar1 = (uint)lVar9;
  }
  bVar20 = uVar1 < 0x1f;
  uVar11 = 0x1f;
LAB_0090b4ee:
  if (bVar20) {
    uVar11 = (ushort)uVar1;
  }
  uVar11 = uVar11 | uVar19;
LAB_0090b4f4:
  *(ushort *)dst = uVar11;
  return;
}

Assistant:

void PixelBufferAccess::setPixel (const Vec4& color, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
		{
			writeRGBA8888Float(pixelPtr, color);
			return;
		}
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
		{
			writeRGB888Float(pixelPtr, color);
			return;
		}
	}

#define PN(VAL, OFFS, BITS)		(unormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PS(VAL, OFFS, BITS)		(snormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PU(VAL, OFFS, BITS)		(uintToChannel((VAL), (BITS)) << (OFFS))
#define PI(VAL, OFFS, BITS)		(intToChannel((VAL), (BITS)) << (OFFS))

	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:		*((deUint8 *)pixelPtr) = (deUint8)(PN(color[0], 4, 4) | PN(color[1], 0, 4));						break;
		case TextureFormat::UNSIGNED_BYTE_44:	*((deUint8 *)pixelPtr) = (deUint8)(PU((deUint32)color[0], 4, 4) | PU((deUint32)color[1], 0, 4));	break;
		case TextureFormat::UNORM_INT_101010:	*((deUint32*)pixelPtr) = PN(color[0], 22, 10) | PN(color[1], 12, 10) | PN(color[2], 2, 10);			break;

		case TextureFormat::UNORM_SHORT_565:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 5, 6) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_565:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 5, 6) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_555:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 10, 5) | PN(swizzled[1], 5, 5) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_4444:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 12, 4) | PN(swizzled[1], 8, 4) | PN(swizzled[2], 4, 4) | PN(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_4444:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 12, 4) | PU(swizzled[1], 8, 4) | PU(swizzled[2], 4, 4) | PU(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNORM_SHORT_5551:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 6, 5) | PN(swizzled[2], 1, 5) | PN(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_SHORT_1555:
		{
			const Vec4 swizzled = color.swizzle(3,0,1,2); // RGBA -> ARGB
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 15, 1) | PN(swizzled[1], 10, 5) | PN(swizzled[2], 5, 5) | PN(swizzled[3], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_5551:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 6, 5) | PU(swizzled[2], 1, 5) | PU(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PN(u[0], 0, 10) | PN(u[1], 10, 10) | PN(u[2], 20, 10) | PN(u[3], 30, 2);
			break;
		}

		case TextureFormat::SNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PS(u[0], 0, 10) | PS(u[1], 10, 10) | PS(u[2], 20, 10) | PS(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_1010102_REV:
		{
			const UVec4 u = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PU(u[0], 0, 10) | PU(u[1], 10, 10) | PU(u[2], 20, 10) | PU(u[3], 30, 2);
			break;
		}

		case TextureFormat::SIGNED_INT_1010102_REV:
		{
			const IVec4 u = swizzleRB(color.cast<deInt32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PI(u[0], 0, 10) | PI(u[1], 10, 10) | PI(u[2], 20, 10) | PI(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			*((deUint32*)pixelPtr) = Float11(color[0]).bits() | (Float11(color[1]).bits() << 11) | (Float10(color[2]).bits() << 22);
			break;

		case TextureFormat::UNSIGNED_INT_999_E5_REV:
			*((deUint32*)pixelPtr) = packRGB999E5(color);
			break;

		default:
		{
			// Generic path.
			int								numChannels	= getNumUsedChannels(m_format.order);
			const TextureSwizzle::Channel*	map			= getChannelWriteSwizzle(m_format.order).components;
			int								channelSize	= getChannelSize(m_format.type);

			for (int c = 0; c < numChannels; c++)
			{
				DE_ASSERT(deInRange32(map[c], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3));
				floatToChannel(pixelPtr + channelSize*c, color[map[c]], m_format.type);
			}
			break;
		}
	}

#undef PN
#undef PS
#undef PU
#undef PI
}